

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O0

char * ly_format2str(LY_VALUE_FORMAT format)

{
  char *pcStack_10;
  LY_VALUE_FORMAT format_local;
  
  switch(format) {
  case LY_VALUE_CANON:
    pcStack_10 = "canonical";
    break;
  case LY_VALUE_SCHEMA:
    pcStack_10 = "schema imports";
    break;
  case LY_VALUE_SCHEMA_RESOLVED:
    pcStack_10 = "schema stored mapping";
    break;
  case LY_VALUE_XML:
    pcStack_10 = "XML prefixes";
    break;
  case LY_VALUE_JSON:
    pcStack_10 = "JSON module names";
    break;
  case LY_VALUE_LYB:
    pcStack_10 = "LYB prefixes";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char *
ly_format2str(LY_VALUE_FORMAT format)
{
    switch (format) {
    case LY_VALUE_CANON:
        return "canonical";
    case LY_VALUE_SCHEMA:
        return "schema imports";
    case LY_VALUE_SCHEMA_RESOLVED:
        return "schema stored mapping";
    case LY_VALUE_XML:
        return "XML prefixes";
    case LY_VALUE_JSON:
        return "JSON module names";
    case LY_VALUE_LYB:
        return "LYB prefixes";
    default:
        break;
    }

    return NULL;
}